

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  mutex *__mutex;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this;
  char *pcVar1;
  LogSeverity severity_00;
  int iVar2;
  LogDestination *pLVar3;
  pointer __p;
  LogSeverity local_8c;
  CheckOpString local_88;
  LogMessageFatal local_80;
  
  local_80.super_LogMessage.allocated_ =
       (LogMessageData *)((ulong)local_80.super_LogMessage.allocated_ & 0xffffffff00000000);
  local_8c = severity;
  if ((int)severity < 0) {
    local_88.str_ =
         MakeCheckOpString<google::LogSeverity,int>(&local_8c,(int *)&local_80,"severity >= 0");
  }
  else {
    local_88.str_ = (string *)0x0;
  }
  if (local_88.str_ == (string *)0x0) {
    local_80.super_LogMessage.allocated_ =
         (LogMessageData *)CONCAT44(local_80.super_LogMessage.allocated_._4_4_,4);
    if ((int)local_8c < 4) {
      local_88.str_ = (string *)0x0;
    }
    else {
      local_88.str_ =
           MakeCheckOpString<google::LogSeverity,int>
                     (&local_8c,(int *)&local_80,"severity < NUM_SEVERITIES");
    }
    if (local_88.str_ == (string *)0x0) {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
      severity_00 = local_8c;
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
      this = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
              *)(&log_destinations_ + local_8c);
      if ((this->_M_t).
          super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
          .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl ==
          (LogDestination *)0x0) {
        pLVar3 = (LogDestination *)operator_new(0xd0);
        LogDestination(pLVar3,severity_00,(char *)0x0);
        local_80.super_LogMessage.allocated_ = (LogMessageData *)0x0;
        std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
        reset(this,pLVar3);
        std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
        ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                     *)&local_80);
      }
      pLVar3 = (this->_M_t).
               super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
               .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
      __mutex = &(pLVar3->fileobject_).mutex_;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar2 == 0) {
        pcVar1 = (char *)(pLVar3->fileobject_).symlink_basename_._M_string_length;
        strlen(symlink_basename);
        std::__cxx11::string::_M_replace
                  ((ulong)&(pLVar3->fileobject_).symlink_basename_,0,pcVar1,(ulong)symlink_basename)
        ;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
        return;
      }
      std::__throw_system_error(iVar2);
    }
    iVar2 = 0x291;
  }
  else {
    iVar2 = 0x290;
  }
  LogMessageFatal::LogMessageFatal
            (&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,iVar2,&local_88);
  LogMessageFatal::~LogMessageFatal(&local_80);
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}